

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int btreeInvokeBusyHandler(void *pArg)

{
  long lVar1;
  code *pcVar2;
  int iVar3;
  int iVar4;
  
  lVar1 = *(long *)((long)pArg + 8);
  pcVar2 = *(code **)(lVar1 + 0x228);
  iVar3 = 0;
  if ((pcVar2 != (code *)0x0) && (-1 < *(int *)(lVar1 + 0x238))) {
    if (*(char *)(lVar1 + 0x23c) == '\0') {
      iVar3 = (*pcVar2)(*(undefined8 *)(lVar1 + 0x230));
    }
    else {
      iVar3 = (*pcVar2)(*(undefined8 *)(lVar1 + 0x230),*(int *)(lVar1 + 0x238),
                        *(undefined8 *)(*pArg + 0x48));
    }
    if (iVar3 == 0) {
      iVar4 = -1;
    }
    else {
      iVar4 = *(int *)(lVar1 + 0x238) + 1;
    }
    *(int *)(lVar1 + 0x238) = iVar4;
  }
  return iVar3;
}

Assistant:

static int btreeInvokeBusyHandler(void *pArg){
  BtShared *pBt = (BtShared*)pArg;
  assert( pBt->db );
  assert( sqlite3_mutex_held(pBt->db->mutex) );
  return sqlite3InvokeBusyHandler(&pBt->db->busyHandler,
                                  sqlite3PagerFile(pBt->pPager));
}